

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O2

char * __thiscall TreeModel::index(TreeModel *this,char *__s,int __c)

{
  char cVar1;
  bool bVar2;
  TreeItem *pTVar3;
  uint in_ECX;
  quintptr *pqVar4;
  QModelIndex *in_R8;
  
  cVar1 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if (cVar1 == '\0') {
    *(undefined8 *)this = 0xffffffffffffffff;
    *(undefined8 *)&this->field_0x8 = 0;
    this->rootItem = (TreeItem *)0x0;
  }
  else {
    bVar2 = QModelIndex::isValid(in_R8);
    pqVar4 = (quintptr *)(__s + 0x10);
    if (bVar2) {
      pqVar4 = &in_R8->i;
    }
    pTVar3 = TreeItem::child((TreeItem *)*pqVar4,__c);
    if (pTVar3 == (TreeItem *)0x0) {
      *(undefined8 *)this = 0xffffffffffffffff;
      *(undefined8 *)&this->field_0x8 = 0;
      this->rootItem = (TreeItem *)0x0;
    }
    else {
      *(int *)this = __c;
      *(uint *)&this->field_0x4 = in_ECX;
      *(TreeItem **)&this->field_0x8 = pTVar3;
      this->rootItem = (TreeItem *)__s;
    }
  }
  return (char *)this;
}

Assistant:

UModelIndex TreeModel::index(int row, int column, const UModelIndex &parent) const
{
    if (!hasIndex(row, column, parent))
        return UModelIndex();
    
    TreeItem *parentItem;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
        parentItem = static_cast<TreeItem*>(parent.internalPointer());
    
    TreeItem *childItem = parentItem->child(row);
    if (childItem)
        return createIndex(row, column, childItem);
    else
        return UModelIndex();
}